

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_encoding_test.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_36518::FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test::
TestBody(FieldEncodingTest_TestValueOfCodeReturnsSameFieldEncodingType_Test *this)

{
  char *pcVar1;
  AssertHelper local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar;
  
  local_28.ptr_._0_1_ = 0x30;
  local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x30);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
            ((internal *)&gtest_ar,"FieldEncodingEnum::NOOP",
             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::NOOP)",
             (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_28.ptr_._0_1_ = 0x31;
    local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x31);
    testing::internal::
    CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
              ((internal *)&gtest_ar,"FieldEncodingEnum::FIXED1",
               "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED1)",
               (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                 ,0x1c,pcVar1);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_28.ptr_._0_1_ = 0x32;
      local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x32);
      testing::internal::
      CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                ((internal *)&gtest_ar,"FieldEncodingEnum::FIXED2",
                 "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED2)",
                 (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                   ,0x1d,pcVar1);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_28.ptr_._0_1_ = 0x33;
        local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x33);
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                  ((internal *)&gtest_ar,"FieldEncodingEnum::FIXED3",
                   "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED3)",
                   (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                     ,0x1e,pcVar1);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_28.ptr_._0_1_ = 0x34;
          local_30.data_._0_1_ = bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x34)
          ;
          testing::internal::
          CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                    ((internal *)&gtest_ar,"FieldEncodingEnum::FIXED4",
                     "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED4)",
                     (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                       ,0x1f,pcVar1);
            testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_28.ptr_._0_1_ = 0x38;
            local_30.data_._0_1_ =
                 bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x38);
            testing::internal::
            CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                      ((internal *)&gtest_ar,"FieldEncodingEnum::FIXED8",
                       "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED8)",
                       (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_28);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar1 = "";
              }
              else {
                pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_30,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                         ,0x20,pcVar1);
              testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              local_28.ptr_._0_1_ = 0x40;
              local_30.data_._0_1_ =
                   bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x40);
              testing::internal::
              CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                        ((internal *)&gtest_ar,"FieldEncodingEnum::FIXED16",
                         "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED16)",
                         (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_28);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar1 = "";
                }
                else {
                  pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_30,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                           ,0x21,pcVar1);
                testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_28.ptr_._0_1_ = 0x42;
                local_30.data_._0_1_ =
                     bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x42);
                testing::internal::
                CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                          ((internal *)&gtest_ar,"FieldEncodingEnum::BYTE_ARRAY",
                           "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::BYTE_ARRAY)",
                           (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_28);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_30,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                             ,0x22,pcVar1);
                  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  local_28.ptr_._0_1_ = 0x53;
                  local_30.data_._0_1_ =
                       bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x53);
                  testing::internal::
                  CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                            ((internal *)&gtest_ar,"FieldEncodingEnum::VARINT_STRING",
                             "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT_STRING)"
                             ,(FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
                  if (gtest_ar.success_ != false) {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    local_28.ptr_._0_1_ = 0x56;
                    local_30.data_._0_1_ =
                         bidfx_public_api::price::pixie::FieldEncodingMethods::ValueOf(0x56);
                    testing::internal::
                    CmpHelperEQ<bidfx_public_api::price::pixie::FieldEncodingEnum,bidfx_public_api::price::pixie::FieldEncodingEnum>
                              ((internal *)&gtest_ar,"FieldEncodingEnum::VARINT",
                               "FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT)",
                               (FieldEncodingEnum *)&local_28,(FieldEncodingEnum *)&local_30);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&local_28);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar1 = "";
                      }
                      else {
                        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_30,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                                 ,0x24,pcVar1);
                      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&local_28);
                    }
                    goto LAB_00166865;
                  }
                  testing::Message::Message((Message *)&local_28);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar1 = "";
                  }
                  else {
                    pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_30,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_encoding_test.cpp"
                             ,0x23,pcVar1);
                  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
LAB_00166865:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FieldEncodingTest, TestValueOfCodeReturnsSameFieldEncodingType)
{
    ASSERT_EQ(FieldEncodingEnum::NOOP, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::NOOP));
    ASSERT_EQ(FieldEncodingEnum::FIXED1, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED1));
    ASSERT_EQ(FieldEncodingEnum::FIXED2, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED2));
    ASSERT_EQ(FieldEncodingEnum::FIXED3, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED3));
    ASSERT_EQ(FieldEncodingEnum::FIXED4, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED4));
    ASSERT_EQ(FieldEncodingEnum::FIXED8, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED8));
    ASSERT_EQ(FieldEncodingEnum::FIXED16, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::FIXED16));
    ASSERT_EQ(FieldEncodingEnum::BYTE_ARRAY, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::BYTE_ARRAY));
    ASSERT_EQ(FieldEncodingEnum::VARINT_STRING, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT_STRING));
    ASSERT_EQ(FieldEncodingEnum::VARINT, FieldEncodingMethods::ValueOf((char) FieldEncodingEnum::VARINT));
}